

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O0

bool __thiscall VCIQuad::solveQuadMetric(VCIQuad *this,Matrix4d *E,Vector3d *result)

{
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_01;
  Scalar *pSVar1;
  Scalar *pSVar2;
  RealScalar RVar3;
  RealScalar RVar4;
  double relative_error;
  Vector4d x;
  Vector4d b;
  Matrix4d E1;
  ReturnByValue<Eigen::internal::solve_retval_base<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  *in_stack_fffffffffffffb08;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false> *in_stack_fffffffffffffb10;
  Scalar SVar5;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *in_stack_fffffffffffffb18;
  ColPivHouseholderQR<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *in_stack_fffffffffffffb20;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_02;
  Index in_stack_fffffffffffffb28;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> *in_stack_fffffffffffffb30;
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other;
  Scalar *in_stack_fffffffffffffb38;
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>_>
  *this_03;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
  *in_stack_fffffffffffffb40;
  MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>_>
  local_228 [64];
  MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_1e8 [32];
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)0x27e834);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18,
             (Index)in_stack_fffffffffffffb10);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18,
             (Index)in_stack_fffffffffffffb10);
  Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,1,4,false>::operator=
            (in_stack_fffffffffffffb10,
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
             in_stack_fffffffffffffb08);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18,
             (Index)in_stack_fffffffffffffb10);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::operator<<
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
             in_stack_fffffffffffffb18,(Scalar *)in_stack_fffffffffffffb10);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                     *)0x27e9bc);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18,
             (Index)in_stack_fffffffffffffb10);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::operator<<
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
             in_stack_fffffffffffffb18,(Scalar *)in_stack_fffffffffffffb10);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>::operator()
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,(Index)in_stack_fffffffffffffb20);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                     *)0x27eac5);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::row
            ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18,
             (Index)in_stack_fffffffffffffb10);
  local_1b0 = 0;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::operator<<
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_> *)
             in_stack_fffffffffffffb18,(Scalar *)in_stack_fffffffffffffb10);
  local_1b8 = 0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_1c0 = 0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_1c8 = 0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  operator_(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1,_4,_false>_>
                     *)0x27eb8c);
  other = local_1e8;
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x27eb9e);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x27ebab);
  this_03 = local_228;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator<<
            ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffb18,
             (Scalar *)in_stack_fffffffffffffb10);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                       in_stack_fffffffffffffb40,(Scalar *)this_03);
  this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                      (this_00,(Scalar *)this_03);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
            (this_00,(Scalar *)this_03);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x27ec53);
  Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::colPivHouseholderQr
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)in_stack_fffffffffffffb18);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,4,4,0,4,4>>::
  solve<Eigen::Matrix<double,4,1,0,4,1>>(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  Eigen::Matrix<double,4,1,0,4,1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
            ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)this_01,
             (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)in_stack_fffffffffffffb20);
  Eigen::
  MatrixBase<Eigen::CoeffBasedProduct<Eigen::Matrix<double,4,4,0,4,4>const&,Eigen::Matrix<double,4,1,0,4,1>const&,6>>
  ::operator-(this_03,other);
  RVar3 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::CoeffBasedProduct<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_&,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_&,_6>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                  *)0x27ece9);
  RVar4 = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)0x27ecfb);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_fffffffffffffb20,(Index)in_stack_fffffffffffffb18);
  SVar5 = *pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffb20,(Index)in_stack_fffffffffffffb18);
  *pSVar2 = SVar5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_fffffffffffffb20,(Index)in_stack_fffffffffffffb18);
  SVar5 = *pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffb20,(Index)SVar5);
  *pSVar2 = SVar5;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_fffffffffffffb20,(Index)SVar5);
  this_02 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)*pSVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                     (this_02,(Index)SVar5);
  *pSVar2 = (Scalar)this_02;
  return RVar3 / RVar4 < 1e-06;
}

Assistant:

bool VCIQuad::solveQuadMetric(const Matrix4d& E, Vector3d& result) {
	Matrix4d E1;
	E1.row(0) = E.row(0);
	E1.row(1) << E(0, 1), E(1, 1), E(1, 2), E(1, 3);
	E1.row(2) << E(0, 2), E(1, 2), E(2, 2), E(2, 3);
	E1.row(3) << 0, 0, 0, 1;
	Vector4d b, x;
	b << 0, 0, 0, 1;
	x = E1.colPivHouseholderQr().solve(b);
	double relative_error = (E1 * x - b).norm() / b.norm();
	result(0) = x(0);
	result(1) = x(1);
	result(2) = x(2);
	return relative_error < 1e-6;
}